

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O3

int yymatchChar(GREG *G,int c)

{
  int iVar1;
  
  iVar1 = G->pos;
  if (G->limit <= iVar1) {
    iVar1 = yyrefill(G);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = G->pos;
  }
  if ((uint)(byte)G->buf[iVar1] != c) {
    return 0;
  }
  G->pos = iVar1 + 1;
  return 1;
}

Assistant:

YY_LOCAL(int) yymatchChar(GREG *G, int c)
{
  if (G->pos >= G->limit && !yyrefill(G)) return 0;
  if ((unsigned char)G->buf[G->pos] == c)
    {
      ++G->pos;
      if (c<32) { yyprintf((stderr, "  ok   yymatchChar '0x%x'", c));}
      else      { yyprintf((stderr, "  ok   yymatchChar '%c'", c));}
      yyprintfGcontext;
      yyprintf((stderr, "\n"));
      return 1;
    }
  if (c<32) { yyprintfv((stderr, "  fail yymatchChar '0x%x'", c));}
  else      { yyprintfv((stderr, "  fail yymatchChar '%c'", c));}
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));
  return 0;
}